

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

MeasureUnit *
icu_63::number::impl::stem_to_object::unit(MeasureUnit *__return_storage_ptr__,StemEnum stem)

{
  MeasureUnit local_70;
  MeasureUnit local_58;
  MeasureUnit local_30;
  StemEnum local_14;
  MeasureUnit *pMStack_10;
  StemEnum stem_local;
  
  local_14 = stem;
  pMStack_10 = __return_storage_ptr__;
  if (stem == STEM_BASE_UNIT) {
    NoUnit::base();
    MeasureUnit::MeasureUnit(__return_storage_ptr__,&local_30);
    NoUnit::~NoUnit((NoUnit *)&local_30);
  }
  else if (stem == STEM_PERCENT) {
    NoUnit::percent();
    MeasureUnit::MeasureUnit(__return_storage_ptr__,&local_58);
    NoUnit::~NoUnit((NoUnit *)&local_58);
  }
  else if (stem == STEM_PERMILLE) {
    NoUnit::permille();
    MeasureUnit::MeasureUnit(__return_storage_ptr__,&local_70);
    NoUnit::~NoUnit((NoUnit *)&local_70);
  }
  else {
    MeasureUnit::MeasureUnit(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

MeasureUnit stem_to_object::unit(skeleton::StemEnum stem) {
    switch (stem) {
        case STEM_BASE_UNIT:
            // Slicing is okay
            return NoUnit::base(); // NOLINT
        case STEM_PERCENT:
            // Slicing is okay
            return NoUnit::percent(); // NOLINT
        case STEM_PERMILLE:
            // Slicing is okay
            return NoUnit::permille(); // NOLINT
        default:
            U_ASSERT(false);
            return {}; // return a value: silence compiler warning
    }
}